

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O3

void __thiscall QSupportedWritingSystems::detach(QSupportedWritingSystems *this)

{
  Data *pDVar1;
  QWritingSystemsPrivate *pQVar2;
  QWritingSystemsPrivate *pQVar3;
  
  pQVar3 = this->d;
  if ((pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 1) {
    pQVar2 = (QWritingSystemsPrivate *)operator_new(0x20);
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pDVar1 = (pQVar3->list).d.d;
    (pQVar2->list).d.d = pDVar1;
    (pQVar2->list).d.ptr = (pQVar3->list).d.ptr;
    (pQVar2->list).d.size = (pQVar3->list).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar3 = this->d;
    }
    LOCK();
    (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      pQVar3 = this->d;
      if ((pQVar3 != (QWritingSystemsPrivate *)0x0) &&
         (pDVar1 = (pQVar3->list).d.d, pDVar1 != (Data *)0x0)) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((pQVar3->list).d.d)->super_QArrayData,1,0x10);
        }
      }
      operator_delete(pQVar3,0x20);
    }
    this->d = pQVar2;
  }
  return;
}

Assistant:

void QSupportedWritingSystems::detach()
{
    if (d->ref.loadRelaxed() != 1) {
        QWritingSystemsPrivate *newd = new QWritingSystemsPrivate(d);
        if (!d->ref.deref())
            delete d;
        d = newd;
    }
}